

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<FileInfoCacheKey,QFileInfo>::emplace<QFileInfo_const&>
          (QHash<FileInfoCacheKey,QFileInfo> *this,FileInfoCacheKey *key,QFileInfo *args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<FileInfoCacheKey,_QFileInfo> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_001905da:
    pDVar2 = *(Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> **)this;
    local_30.d = pDVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_>::detached
                         (pDVar2);
      *(Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> **)this = pDVar2;
    }
    pVar3 = (piter)emplace_helper<QFileInfo_const&>(this,key,args);
    QHash<FileInfoCacheKey,_QFileInfo>::~QHash(&local_30);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      if ((pDVar1 != (Data *)0x0) &&
         ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_001905da;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar3 = (piter)emplace_helper<QFileInfo_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_0019065f;
    }
    QFileInfo::QFileInfo((QFileInfo *)&local_30,args);
    pVar3 = (piter)QHash<FileInfoCacheKey,_QFileInfo>::emplace_helper<QFileInfo>
                             ((QHash<FileInfoCacheKey,_QFileInfo> *)this,key,(QFileInfo *)&local_30)
    ;
    QFileInfo::~QFileInfo((QFileInfo *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar3;
  }
LAB_0019065f:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }